

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmmeta.h
# Opt level: O1

int __thiscall
CVmMetaTable::prop_to_vector_idx(CVmMetaTable *this,uint reg_table_idx,vm_prop_id_t prop)

{
  ushort uVar1;
  vm_meta_entry_t *pvVar2;
  uint uVar3;
  long lVar4;
  
  pvVar2 = this->table_;
  lVar4 = (long)this->reverse_map_[reg_table_idx];
  uVar3 = 0;
  if (pvVar2 != (vm_meta_entry_t *)0x0 && -1 < lVar4) {
    uVar1 = pvVar2[lVar4].min_prop_;
    if ((uVar1 <= prop) && ((ulong)prop < pvVar2[lVar4].prop_xlat_cnt_ + (ulong)uVar1)) {
      uVar3 = (uint)pvVar2[lVar4].prop_xlat_[(ulong)prop - (ulong)uVar1];
    }
  }
  return uVar3;
}

Assistant:

vm_meta_entry_t *get_entry_from_reg(int reg_idx)
    {
        /* translate the registration table index into a dependency index */
        int dep_idx = get_dependency_index(reg_idx);

        /* 
         *   if we have a valid dependency index, return it; otherwise,
         *   return null 
         */
        if (dep_idx >= 0)
            return &table_[dep_idx];
        else
            return 0;
    }